

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket.c
# Opt level: O2

_Bool ws_contains_word(char *phrase,char *word)

{
  int iVar1;
  size_t n;
  char *pcVar2;
  
  n = strlen(word);
  while( true ) {
    if ((phrase == (char *)0x0) || (*phrase == '\0')) {
      return false;
    }
    iVar1 = nni_strncasecmp(phrase,word,n);
    if (((iVar1 == 0) && ((ulong)(byte)phrase[n] < 0x2d)) &&
       ((0x100100000001U >> ((ulong)(byte)phrase[n] & 0x3f) & 1) != 0)) break;
    pcVar2 = strchr(phrase,0x20);
    phrase = (char *)0x0;
    if (pcVar2 != (char *)0x0) {
      for (; (*pcVar2 == ',' || (phrase = pcVar2, *pcVar2 == ' ')); pcVar2 = pcVar2 + 1) {
      }
    }
  }
  return true;
}

Assistant:

static bool
ws_contains_word(const char *phrase, const char *word)
{
	size_t len = strlen(word);

	while ((phrase != NULL) && (*phrase != '\0')) {
		if ((nni_strncasecmp(phrase, word, len) == 0) &&
		    ((phrase[len] == 0) || (phrase[len] == ' ') ||
		        (phrase[len] == ','))) {
			return (true);
		}
		// Skip to next word.
		if ((phrase = strchr(phrase, ' ')) != NULL) {
			while ((*phrase == ' ') || (*phrase == ',')) {
				phrase++;
			}
		}
	}
	return (false);
}